

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1,false>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      end,anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  c;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  end_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  pointer piVar6;
  pointer piVar7;
  pair<int,_int> pVar8;
  int iVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  HighsInt minLen1;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var15;
  pair<int,_int> *ppVar16;
  pair<int,_int> *ppVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  pair<int,_int> *ppVar21;
  int iVar22;
  ulong uVar23;
  int *piVar24;
  int iVar25;
  pair<int,_int> *ppVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var30;
  long lVar31;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:4999:7)>
  __cmp;
  int local_a0;
  int local_98;
  int local_58;
  
  c._M_current = end._M_current + -1;
LAB_00323eee:
  lVar12 = (long)end._M_current - (long)begin._M_current;
  uVar14 = lVar12 >> 3;
  if (0x17 < (long)uVar14) {
    uVar20 = uVar14 >> 1;
    _Var15._M_current = begin._M_current + uVar20;
    if ((long)uVar14 < 0x81) {
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                (_Var15,begin,c,comp);
    }
    else {
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                (begin,_Var15,c,comp);
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                (begin._M_current + 1,begin._M_current + (uVar20 - 1),end._M_current + -2,comp);
      _Var30._M_current = begin._M_current + uVar20 + 1;
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                (begin._M_current + 2,_Var30,end._M_current + -3,comp);
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                (begin._M_current + (uVar20 - 1),_Var15,_Var30,comp);
      pVar8 = *begin._M_current;
      *begin._M_current = _Var30._M_current[-1];
      _Var30._M_current[-1] = pVar8;
    }
    if ((leftmost & 1U) == 0) {
      uVar1 = begin._M_current[-1].first;
      piVar6 = ((comp.this)->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = ((comp.this)->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = begin._M_current[-1].second;
      iVar22 = piVar7[(int)uVar2];
      iVar18 = piVar6[(int)uVar1];
      iVar5 = iVar18;
      if (iVar22 < iVar18) {
        iVar5 = iVar22;
      }
      uVar3 = (begin._M_current)->first;
      uVar4 = (begin._M_current)->second;
      iVar11 = piVar7[(int)uVar4];
      iVar25 = piVar6[(int)uVar3];
      iVar13 = iVar25;
      if (iVar11 < iVar25) {
        iVar13 = iVar11;
      }
      if ((iVar5 != 2) || (iVar13 == 2)) {
        if ((iVar5 == 2) || (iVar13 != 2)) {
          lVar29 = (long)iVar18 * (long)iVar22;
          lVar19 = (long)iVar25 * (long)iVar11;
          if (lVar29 < lVar19) goto LAB_00324613;
          if (lVar29 - lVar19 == 0 || lVar29 < lVar19) {
            if (iVar5 < iVar13) goto LAB_00324613;
            if (iVar5 <= iVar13) {
              uVar28 = ((ulong)uVar2 + 0x80c8963be3e4c2f3) * ((ulong)uVar1 + 0xc8497d2a400d9551) >>
                       0x20 ^ ((ulong)uVar2 + 0x8a183895eeac1536) *
                              ((ulong)uVar1 + 0x42d8680e260ae5b);
              uVar20 = ((ulong)uVar4 + 0x80c8963be3e4c2f3) * ((ulong)uVar3 + 0xc8497d2a400d9551) >>
                       0x20 ^ ((ulong)uVar4 + 0x8a183895eeac1536) *
                              ((ulong)uVar3 + 0x42d8680e260ae5b);
              if ((uVar28 < uVar20) ||
                 ((uVar28 <= uVar20 &&
                  (((int)uVar1 < (int)uVar3 || ((int)uVar1 <= (int)uVar3 && (int)uVar2 < (int)uVar4)
                   ))))) goto LAB_00324613;
            }
          }
        }
        pVar8 = *begin._M_current;
        iVar11 = pVar8.first;
        iVar22 = piVar7[(long)pVar8 >> 0x20];
        iVar18 = piVar6[iVar11];
        iVar5 = iVar18;
        if (iVar22 < iVar18) {
          iVar5 = iVar22;
        }
        lVar29 = (long)iVar18 * (long)iVar22;
        uVar14 = (((ulong)pVar8 >> 0x20) + 0x80c8963be3e4c2f3) *
                 (((ulong)pVar8 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                 (((ulong)pVar8 >> 0x20) + 0x8a183895eeac1536) *
                 (((ulong)pVar8 & 0xffffffff) + 0x42d8680e260ae5b);
        lVar12 = 0;
        do {
          uVar1 = *(uint *)((long)&(c._M_current)->first + lVar12);
          uVar2 = *(uint *)((long)end._M_current + lVar12 + -4);
          iVar22 = piVar7[(int)uVar2];
          iVar18 = piVar6[(int)uVar1];
          iVar25 = iVar18;
          if (iVar22 < iVar18) {
            iVar25 = iVar22;
          }
          if ((iVar5 != 2) || (iVar25 == 2)) {
            local_a0 = pVar8.second;
            if ((iVar5 != 2) && (iVar25 == 2)) goto LAB_00324a0d;
            lVar19 = (long)iVar18 * (long)iVar22;
            if ((lVar19 <= lVar29) &&
               ((lVar29 - lVar19 != 0 && lVar19 <= lVar29 ||
                ((iVar25 <= iVar5 &&
                 ((iVar25 < iVar5 ||
                  ((uVar20 = ((ulong)uVar2 + 0x80c8963be3e4c2f3) *
                             ((ulong)uVar1 + 0xc8497d2a400d9551) >> 0x20 ^
                             ((ulong)uVar2 + 0x8a183895eeac1536) *
                             ((ulong)uVar1 + 0x42d8680e260ae5b), uVar20 <= uVar14 &&
                   ((uVar20 < uVar14 ||
                    (((int)uVar1 <= iVar11 && (((int)uVar1 < iVar11 || ((int)uVar2 <= local_a0))))))
                   )))))))))) goto LAB_00324a0d;
          }
          lVar12 = lVar12 + -8;
        } while( true );
      }
    }
LAB_00324613:
    pVar8 = *begin._M_current;
    piVar6 = ((comp.this)->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = ((comp.this)->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar11 = pVar8.first;
    iVar22 = piVar7[(long)pVar8 >> 0x20];
    iVar18 = piVar6[iVar11];
    iVar5 = iVar18;
    if (iVar22 < iVar18) {
      iVar5 = iVar22;
    }
    lVar29 = (long)iVar18 * (long)iVar22;
    uVar20 = (((ulong)pVar8 >> 0x20) + 0x80c8963be3e4c2f3) *
             (((ulong)pVar8 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
             (((ulong)pVar8 >> 0x20) + 0x8a183895eeac1536) *
             (((ulong)pVar8 & 0xffffffff) + 0x42d8680e260ae5b);
    lVar19 = 8;
    do {
      uVar1 = *(uint *)((long)&(begin._M_current)->first + lVar19);
      uVar2 = *(uint *)((long)&(begin._M_current)->second + lVar19);
      iVar22 = piVar7[(int)uVar2];
      iVar18 = piVar6[(int)uVar1];
      iVar25 = iVar18;
      if (iVar22 < iVar18) {
        iVar25 = iVar22;
      }
      if ((iVar25 != 2) || (iVar5 == 2)) {
        iVar13 = pVar8.second;
        if ((iVar5 == 2) && (iVar25 != 2)) goto LAB_0032475e;
        lVar31 = (long)iVar18 * (long)iVar22;
        if ((lVar29 <= lVar31) &&
           ((lVar31 - lVar29 != 0 && lVar29 <= lVar31 ||
            ((iVar5 <= iVar25 &&
             ((iVar5 < iVar25 ||
              ((uVar28 = ((ulong)uVar2 + 0x80c8963be3e4c2f3) * ((ulong)uVar1 + 0xc8497d2a400d9551)
                         >> 0x20 ^ ((ulong)uVar2 + 0x8a183895eeac1536) *
                                   ((ulong)uVar1 + 0x42d8680e260ae5b), uVar20 <= uVar28 &&
               ((uVar20 < uVar28 ||
                ((iVar11 <= (int)uVar1 && ((iVar11 < (int)uVar1 || (iVar13 <= (int)uVar2))))))))))))
            )))) goto LAB_0032475e;
      }
      lVar19 = lVar19 + 8;
    } while( true );
  }
  if ((leftmost & 1U) != 0) {
    if ((begin._M_current == end._M_current) || (begin._M_current + 1 == end._M_current))
    goto LAB_00324597;
    piVar6 = ((comp.this)->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = ((comp.this)->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = 0;
    ppVar17 = begin._M_current + 1;
    _Var15._M_current = begin._M_current;
    do {
      ppVar21 = ppVar17;
      uVar1 = _Var15._M_current[1].first;
      uVar2 = _Var15._M_current[1].second;
      iVar22 = piVar7[(int)uVar2];
      iVar18 = piVar6[(int)uVar1];
      iVar5 = iVar18;
      if (iVar22 < iVar18) {
        iVar5 = iVar22;
      }
      uVar3 = (_Var15._M_current)->first;
      uVar4 = (_Var15._M_current)->second;
      iVar11 = piVar7[(int)uVar4];
      iVar25 = piVar6[(int)uVar3];
      iVar13 = iVar25;
      if (iVar11 < iVar25) {
        iVar13 = iVar11;
      }
      if ((iVar5 == 2) && (iVar13 != 2)) {
LAB_00323f89:
        pVar8 = _Var15._M_current[1];
        ppVar17 = ppVar21 + -1;
        _Var15._M_current[1].first = uVar3;
        ppVar21->second = (_Var15._M_current)->second;
        local_98 = pVar8.second;
        iVar22 = pVar8.first;
        ppVar26 = ppVar21;
        if (ppVar17 != begin._M_current) {
          uVar14 = (((ulong)pVar8 >> 0x20) + 0x80c8963be3e4c2f3) *
                   (((ulong)pVar8 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                   (((ulong)pVar8 >> 0x20) + 0x8a183895eeac1536) *
                   (((ulong)pVar8 & 0xffffffff) + 0x42d8680e260ae5b);
          lVar29 = lVar12;
          do {
            ppVar16 = ppVar17;
            iVar18 = piVar7[(long)pVar8 >> 0x20];
            iVar5 = piVar6[iVar22];
            iVar11 = iVar5;
            if (iVar18 < iVar5) {
              iVar11 = iVar18;
            }
            uVar1 = ppVar16[-1].first;
            uVar2 = ppVar16[-1].second;
            iVar25 = piVar7[(int)uVar2];
            iVar13 = piVar6[(int)uVar1];
            iVar9 = iVar13;
            if (iVar25 < iVar13) {
              iVar9 = iVar25;
            }
            if ((iVar11 != 2) || (iVar9 == 2)) {
              ppVar17 = ppVar16;
              if ((iVar11 != 2) && (iVar9 == 2)) {
                ppVar26 = ppVar16 + 1;
                break;
              }
              lVar19 = (long)iVar5 * (long)iVar18;
              lVar31 = (long)iVar13 * (long)iVar25;
              if ((lVar31 <= lVar19) &&
                 ((lVar19 - lVar31 != 0 && lVar31 <= lVar19 ||
                  ((iVar9 <= iVar11 &&
                   ((iVar9 < iVar11 ||
                    ((uVar20 = ((ulong)uVar2 + 0x80c8963be3e4c2f3) *
                               ((ulong)uVar1 + 0xc8497d2a400d9551) >> 0x20 ^
                               ((ulong)uVar2 + 0x8a183895eeac1536) *
                               ((ulong)uVar1 + 0x42d8680e260ae5b), uVar20 <= uVar14 &&
                     ((uVar20 < uVar14 ||
                      (((int)uVar1 <= iVar22 && (((int)uVar1 < iVar22 || ((int)uVar2 <= local_98))))
                      )))))))))))) break;
            }
            ppVar17 = ppVar16 + -1;
            ppVar16->first = uVar1;
            ppVar16->second = uVar2;
            lVar29 = lVar29 + 8;
            ppVar26 = ppVar16;
          } while (lVar29 != 0);
        }
        ppVar17->first = iVar22;
        ppVar26[-1].second = local_98;
      }
      else if ((iVar5 == 2) || (iVar13 != 2)) {
        lVar19 = (long)iVar18 * (long)iVar22;
        lVar29 = (long)iVar25 * (long)iVar11;
        if (lVar19 < lVar29) goto LAB_00323f89;
        if (lVar19 - lVar29 == 0 || lVar19 < lVar29) {
          if (iVar5 < iVar13) goto LAB_00323f89;
          if (iVar5 <= iVar13) {
            uVar20 = ((ulong)uVar2 + 0x80c8963be3e4c2f3) * ((ulong)uVar1 + 0xc8497d2a400d9551) >>
                     0x20 ^ ((ulong)uVar2 + 0x8a183895eeac1536) * ((ulong)uVar1 + 0x42d8680e260ae5b)
            ;
            uVar14 = ((ulong)uVar4 + 0x80c8963be3e4c2f3) * ((ulong)uVar3 + 0xc8497d2a400d9551) >>
                     0x20 ^ ((ulong)uVar4 + 0x8a183895eeac1536) * ((ulong)uVar3 + 0x42d8680e260ae5b)
            ;
            if ((uVar20 < uVar14) ||
               ((uVar20 <= uVar14 &&
                (((int)uVar1 < (int)uVar3 || ((int)uVar2 < (int)uVar4 && (int)uVar1 <= (int)uVar3)))
                ))) goto LAB_00323f89;
          }
        }
      }
      lVar12 = lVar12 + -8;
      ppVar17 = ppVar21 + 1;
      _Var15._M_current = ppVar21;
    } while (ppVar21 + 1 != end._M_current);
    goto LAB_0032423e;
  }
  if ((begin._M_current != end._M_current) && (begin._M_current + 1 != end._M_current)) {
    piVar6 = ((comp.this)->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = ((comp.this)->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar17 = begin._M_current + 1;
    _Var15._M_current = begin._M_current;
LAB_00324312:
    ppVar21 = ppVar17;
    uVar1 = _Var15._M_current[1].first;
    uVar2 = _Var15._M_current[1].second;
    iVar22 = piVar7[(int)uVar2];
    iVar18 = piVar6[(int)uVar1];
    iVar5 = iVar18;
    if (iVar22 < iVar18) {
      iVar5 = iVar22;
    }
    uVar3 = (_Var15._M_current)->first;
    uVar4 = (_Var15._M_current)->second;
    iVar11 = piVar7[(int)uVar4];
    iVar25 = piVar6[(int)uVar3];
    iVar13 = iVar25;
    if (iVar11 < iVar25) {
      iVar13 = iVar11;
    }
    if ((iVar5 == 2) && (iVar13 != 2)) {
LAB_0032435d:
      pVar8 = *ppVar21;
      iVar22 = pVar8.first;
      uVar14 = (((ulong)pVar8 >> 0x20) + 0x80c8963be3e4c2f3) *
               (((ulong)pVar8 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
               (((ulong)pVar8 >> 0x20) + 0x8a183895eeac1536) *
               (((ulong)pVar8 & 0xffffffff) + 0x42d8680e260ae5b);
      do {
        _Var15._M_current[1] = *_Var15._M_current;
        iVar18 = piVar7[(long)pVar8 >> 0x20];
        iVar5 = piVar6[iVar22];
        iVar11 = iVar5;
        if (iVar18 < iVar5) {
          iVar11 = iVar18;
        }
        uVar1 = _Var15._M_current[-1].first;
        uVar2 = _Var15._M_current[-1].second;
        iVar25 = piVar7[(int)uVar2];
        iVar13 = piVar6[(int)uVar1];
        iVar9 = iVar13;
        if (iVar25 < iVar13) {
          iVar9 = iVar25;
        }
        if ((iVar11 != 2) || (iVar9 == 2)) {
          local_a0 = pVar8.second;
          if ((iVar11 != 2) && (iVar9 == 2)) goto LAB_00324498;
          lVar29 = (long)iVar5 * (long)iVar18;
          lVar12 = (long)iVar13 * (long)iVar25;
          if ((lVar12 <= lVar29) &&
             ((lVar29 - lVar12 != 0 && lVar12 <= lVar29 ||
              ((iVar9 <= iVar11 &&
               ((iVar9 < iVar11 ||
                ((uVar20 = ((ulong)uVar2 + 0x80c8963be3e4c2f3) * ((ulong)uVar1 + 0xc8497d2a400d9551)
                           >> 0x20 ^ ((ulong)uVar2 + 0x8a183895eeac1536) *
                                     ((ulong)uVar1 + 0x42d8680e260ae5b), uVar20 <= uVar14 &&
                 ((uVar20 < uVar14 ||
                  (((int)uVar1 <= iVar22 && (((int)uVar1 < iVar22 || ((int)uVar2 <= local_a0))))))))
                )))))))) goto LAB_00324498;
        }
        _Var15._M_current = _Var15._M_current + -1;
      } while( true );
    }
    if ((iVar5 == 2) || (iVar13 != 2)) {
      lVar29 = (long)iVar18 * (long)iVar22;
      lVar12 = (long)iVar25 * (long)iVar11;
      if (lVar29 < lVar12) goto LAB_0032435d;
      if (lVar29 - lVar12 == 0 || lVar29 < lVar12) {
        if (iVar5 < iVar13) goto LAB_0032435d;
        if (iVar5 <= iVar13) {
          uVar14 = ((ulong)uVar2 + 0x80c8963be3e4c2f3) * ((ulong)uVar1 + 0xc8497d2a400d9551) >> 0x20
                   ^ ((ulong)uVar2 + 0x8a183895eeac1536) * ((ulong)uVar1 + 0x42d8680e260ae5b);
          uVar20 = ((ulong)uVar4 + 0x80c8963be3e4c2f3) * ((ulong)uVar3 + 0xc8497d2a400d9551) >> 0x20
                   ^ ((ulong)uVar4 + 0x8a183895eeac1536) * ((ulong)uVar3 + 0x42d8680e260ae5b);
          if ((uVar14 < uVar20) ||
             ((uVar14 <= uVar20 &&
              (((int)uVar1 < (int)uVar3 || ((int)uVar2 < (int)uVar4 && (int)uVar1 <= (int)uVar3)))))
             ) goto LAB_0032435d;
        }
      }
    }
    goto LAB_003244b9;
  }
LAB_00324597:
  bVar10 = true;
  goto LAB_00325435;
LAB_00324a0d:
  ppVar17 = (pair<int,_int> *)((long)&(c._M_current)->first + lVar12);
  if (lVar12 == 0) {
    _Var15._M_current = begin._M_current;
    if (begin._M_current < ppVar17) {
      ppVar21 = begin._M_current + 1;
      uVar28 = (ulong)begin._M_current[1].first;
      uVar20 = (ulong)begin._M_current[1].second;
      iVar22 = piVar7[uVar20];
      iVar18 = piVar6[uVar28];
      iVar25 = iVar18;
      if (iVar22 < iVar18) {
        iVar25 = iVar22;
      }
      if ((iVar5 != 2) || (_Var15._M_current = ppVar21, iVar25 == 2)) {
        piVar24 = &begin._M_current[2].second;
        do {
          ppVar26 = (pair<int,_int> *)(piVar24 + -3);
          if ((iVar5 == 2) || (iVar25 != 2)) {
            lVar12 = (long)iVar22 * (long)iVar18;
            _Var15._M_current = ppVar26;
            if (lVar29 < lVar12) goto LAB_00324c33;
            if (lVar29 - lVar12 != 0 && lVar12 <= lVar29) goto LAB_00324efe;
            _Var15._M_current = ppVar21;
            if (iVar5 < iVar25) goto LAB_00324c33;
            if (iVar25 < iVar5) goto LAB_00324efe;
            local_58 = (int)uVar28;
            uVar28 = ((uVar20 & 0xffffffff) + 0x80c8963be3e4c2f3) *
                     ((uVar28 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                     ((uVar20 & 0xffffffff) + 0x8a183895eeac1536) *
                     ((uVar28 & 0xffffffff) + 0x42d8680e260ae5b);
            if (uVar14 < uVar28) goto LAB_00324c33;
            if (uVar28 < uVar14) goto LAB_00324efe;
            if (iVar11 < local_58) goto LAB_00324c33;
            if ((ppVar17 <= ppVar26) || (iVar11 <= local_58 && local_a0 < (int)uVar20))
            goto LAB_00324c33;
          }
          else {
LAB_00324efe:
            _Var15._M_current = ppVar21;
            if (ppVar17 <= ppVar26) goto LAB_00324c33;
          }
          ppVar21 = ppVar21 + 1;
          uVar28 = (ulong)((pair<int,_int> *)(piVar24 + -1))->first;
          uVar20 = (ulong)*piVar24;
          iVar22 = piVar7[uVar20];
          iVar18 = piVar6[uVar28];
          iVar25 = iVar18;
          if (iVar22 < iVar18) {
            iVar25 = iVar22;
          }
          piVar24 = piVar24 + 2;
        } while ((iVar5 != 2) || (iVar25 == 2));
        goto LAB_00324b1a;
      }
    }
  }
  else {
    _Var15._M_current = begin._M_current + 1;
    uVar28 = (ulong)begin._M_current[1].first;
    uVar20 = (ulong)begin._M_current[1].second;
    iVar22 = piVar7[uVar20];
    iVar18 = piVar6[uVar28];
    iVar25 = iVar18;
    if (iVar22 < iVar18) {
      iVar25 = iVar22;
    }
    if ((iVar5 != 2) || (iVar25 == 2)) {
      piVar24 = &begin._M_current[2].second;
      do {
        if ((iVar5 == 2) || (iVar25 != 2)) {
          lVar12 = (long)iVar22 * (long)iVar18;
          if (lVar29 < lVar12) goto LAB_00324c33;
          if (lVar29 - lVar12 == 0 || lVar29 < lVar12) {
            if (iVar5 < iVar25) goto LAB_00324c33;
            if (iVar5 <= iVar25) {
              uVar27 = ((uVar20 & 0xffffffff) + 0x80c8963be3e4c2f3) *
                       ((uVar28 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                       ((uVar28 & 0xffffffff) + 0x42d8680e260ae5b) *
                       ((uVar20 & 0xffffffff) + 0x8a183895eeac1536);
              if (uVar14 < uVar27) goto LAB_00324c33;
              if (uVar14 <= uVar27) {
                if (iVar11 < (int)uVar28) goto LAB_00324c33;
                if ((local_a0 < (int)uVar20) && (iVar11 <= (int)uVar28)) break;
              }
            }
          }
        }
        _Var15._M_current = _Var15._M_current + 1;
        uVar28 = (ulong)((pair<int,_int> *)(piVar24 + -1))->first;
        uVar20 = (ulong)*piVar24;
        iVar22 = piVar7[uVar20];
        iVar18 = piVar6[uVar28];
        iVar25 = iVar18;
        if (iVar22 < iVar18) {
          iVar25 = iVar22;
        }
        piVar24 = piVar24 + 2;
      } while ((iVar5 != 2) || (iVar25 == 2));
LAB_00324b1a:
      _Var15._M_current = (pair<int,_int> *)(piVar24 + -3);
    }
  }
LAB_00324c33:
  if (_Var15._M_current < ppVar17) {
    do {
      iVar22 = (_Var15._M_current)->first;
      (_Var15._M_current)->first = ppVar17->first;
      ppVar17->first = iVar22;
      iVar22 = (_Var15._M_current)->second;
      (_Var15._M_current)->second = ppVar17->second;
      ppVar17->second = iVar22;
      iVar22 = piVar7[(long)pVar8 >> 0x20];
      iVar18 = piVar6[iVar11];
      iVar5 = iVar18;
      if (iVar22 < iVar18) {
        iVar5 = iVar22;
      }
      lVar12 = (long)iVar18 * (long)iVar22;
      ppVar21 = ppVar17;
      do {
        do {
          ppVar17 = ppVar21 + -1;
          uVar1 = ppVar17->first;
          uVar2 = ppVar21[-1].second;
          iVar22 = piVar7[(int)uVar2];
          iVar18 = piVar6[(int)uVar1];
          iVar25 = iVar18;
          if (iVar22 < iVar18) {
            iVar25 = iVar22;
          }
          ppVar21 = ppVar17;
        } while ((iVar5 == 2) && (iVar25 != 2));
        if ((iVar5 != 2) && (iVar25 == 2)) break;
        lVar29 = (long)iVar18 * (long)iVar22;
      } while ((lVar12 < lVar29) ||
              ((lVar12 - lVar29 == 0 || lVar12 < lVar29 &&
               ((iVar5 < iVar25 ||
                ((iVar5 <= iVar25 &&
                 ((uVar20 = ((ulong)uVar2 + 0x80c8963be3e4c2f3) *
                            ((ulong)uVar1 + 0xc8497d2a400d9551) >> 0x20 ^
                            ((ulong)uVar2 + 0x8a183895eeac1536) * ((ulong)uVar1 + 0x42d8680e260ae5b)
                  , uVar14 < uVar20 ||
                  ((uVar14 <= uVar20 &&
                   ((iVar11 < (int)uVar1 || ((iVar11 <= (int)uVar1 && (local_a0 < (int)uVar2))))))))
                 ))))))));
      ppVar21 = _Var15._M_current + 1;
      uVar28 = (ulong)_Var15._M_current[1].first;
      uVar20 = (ulong)_Var15._M_current[1].second;
      iVar22 = piVar7[uVar20];
      iVar18 = piVar6[uVar28];
      iVar25 = iVar18;
      if (iVar22 < iVar18) {
        iVar25 = iVar22;
      }
      if ((iVar5 != 2) || (iVar25 == 2)) {
        piVar24 = &_Var15._M_current[2].second;
        do {
          if ((iVar5 == 2) || (iVar25 != 2)) {
            lVar29 = (long)iVar22 * (long)iVar18;
            if (lVar12 < lVar29) break;
            if (lVar12 - lVar29 == 0 || lVar12 < lVar29) {
              if (iVar5 < iVar25) goto LAB_00324e26;
              if (iVar5 <= iVar25) {
                uVar27 = ((uVar20 & 0xffffffff) + 0x80c8963be3e4c2f3) *
                         ((uVar28 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                         ((uVar28 & 0xffffffff) + 0x42d8680e260ae5b) *
                         ((uVar20 & 0xffffffff) + 0x8a183895eeac1536);
                if ((uVar14 < uVar27) ||
                   ((uVar14 <= uVar27 &&
                    ((iVar11 < (int)uVar28 || ((local_a0 < (int)uVar20 && (iVar11 <= (int)uVar28))))
                    )))) goto LAB_00324e26;
              }
            }
          }
          ppVar21 = ppVar21 + 1;
          uVar28 = (ulong)((pair<int,_int> *)(piVar24 + -1))->first;
          uVar20 = (ulong)*piVar24;
          iVar22 = piVar7[uVar20];
          iVar18 = piVar6[uVar28];
          iVar25 = iVar18;
          if (iVar22 < iVar18) {
            iVar25 = iVar22;
          }
          piVar24 = piVar24 + 2;
        } while ((iVar5 != 2) || (iVar25 == 2));
        ppVar21 = (pair<int,_int> *)(piVar24 + -3);
      }
LAB_00324e26:
      _Var15._M_current = ppVar21;
    } while (_Var15._M_current < ppVar17);
  }
  (begin._M_current)->first = ppVar17->first;
  (begin._M_current)->second = ppVar17->second;
  ppVar17->first = iVar11;
  ppVar17->second = local_a0;
  begin._M_current = ppVar17 + 1;
  bVar10 = false;
  goto LAB_00325435;
LAB_0032475e:
  ppVar17 = (pair<int,_int> *)((long)&(begin._M_current)->first + lVar19);
  _Var15._M_current = c._M_current;
  if (lVar19 == 8) {
    _Var15._M_current = end._M_current;
    if (ppVar17 < end._M_current) {
      uVar28 = (ulong)end._M_current[-1].first;
      uVar27 = (ulong)end._M_current[-1].second;
      iVar22 = piVar7[uVar27];
      iVar18 = piVar6[uVar28];
      _Var15._M_current = c._M_current;
      iVar25 = iVar18;
      if (iVar22 < iVar18) {
        iVar25 = iVar22;
      }
      while ((iVar25 != 2 || (iVar5 == 2))) {
        if ((iVar5 == 2) && (iVar25 != 2)) {
LAB_0032485b:
          if (_Var15._M_current <= ppVar17) break;
        }
        else {
          lVar19 = (long)iVar22 * (long)iVar18;
          if (lVar19 < lVar29) break;
          if (lVar19 - lVar29 != 0 && lVar29 <= lVar19) goto LAB_0032485b;
          if (iVar25 < iVar5) break;
          if (iVar5 < iVar25) goto LAB_0032485b;
          uVar23 = ((uVar27 & 0xffffffff) + 0x80c8963be3e4c2f3) *
                   ((uVar28 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                   ((uVar27 & 0xffffffff) + 0x8a183895eeac1536) *
                   ((uVar28 & 0xffffffff) + 0x42d8680e260ae5b);
          if (uVar23 < uVar20) break;
          if (uVar20 < uVar23) goto LAB_0032485b;
          if ((int)uVar28 < iVar11) break;
          if ((_Var15._M_current <= ppVar17) || ((int)uVar28 <= iVar11 && (int)uVar27 < iVar13))
          break;
        }
        ppVar21 = _Var15._M_current + -1;
        uVar28 = (ulong)_Var15._M_current[-1].first;
        uVar27 = (ulong)_Var15._M_current[-1].second;
        iVar22 = piVar7[uVar27];
        iVar18 = piVar6[uVar28];
        _Var15._M_current = ppVar21;
        iVar25 = iVar18;
        if (iVar22 < iVar18) {
          iVar25 = iVar22;
        }
      }
    }
  }
  else {
    uVar28 = (ulong)end._M_current[-1].first;
    uVar27 = (ulong)end._M_current[-1].second;
    iVar22 = piVar7[uVar27];
    iVar18 = piVar6[uVar28];
    iVar25 = iVar18;
    if (iVar22 < iVar18) {
      iVar25 = iVar22;
    }
    while ((iVar25 != 2 || (iVar5 == 2))) {
      if ((iVar5 != 2) || (iVar25 == 2)) {
        lVar19 = (long)iVar22 * (long)iVar18;
        if (lVar19 < lVar29) break;
        if (lVar19 - lVar29 == 0 || lVar19 < lVar29) {
          if (iVar25 < iVar5) break;
          if (iVar25 <= iVar5) {
            uVar23 = ((uVar27 & 0xffffffff) + 0x80c8963be3e4c2f3) *
                     ((uVar28 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                     ((uVar28 & 0xffffffff) + 0x42d8680e260ae5b) *
                     ((uVar27 & 0xffffffff) + 0x8a183895eeac1536);
            if ((uVar23 < uVar20) ||
               ((uVar23 <= uVar20 &&
                (((int)uVar28 < iVar11 || (((int)uVar27 < iVar13 && ((int)uVar28 <= iVar11))))))))
            break;
          }
        }
      }
      ppVar21 = _Var15._M_current + -1;
      uVar28 = (ulong)_Var15._M_current[-1].first;
      uVar27 = (ulong)_Var15._M_current[-1].second;
      iVar22 = piVar7[uVar27];
      iVar18 = piVar6[uVar28];
      _Var15._M_current = ppVar21;
      iVar25 = iVar18;
      if (iVar22 < iVar18) {
        iVar25 = iVar22;
      }
    }
  }
  ppVar21 = _Var15._M_current;
  _Var30._M_current = ppVar17;
  ppVar26 = ppVar17;
  if (ppVar17 < _Var15._M_current) {
LAB_00325065:
    iVar22 = ppVar26->first;
    ppVar26->first = ppVar21->first;
    ppVar21->first = iVar22;
    iVar22 = ppVar26->second;
    ppVar26->second = ppVar21->second;
    ppVar21->second = iVar22;
    iVar22 = piVar7[(long)pVar8 >> 0x20];
    iVar18 = piVar6[iVar11];
    iVar5 = iVar18;
    if (iVar22 < iVar18) {
      iVar5 = iVar22;
    }
    lVar29 = (long)iVar18 * (long)iVar22;
    do {
      do {
        _Var30._M_current = ppVar26 + 1;
        uVar1 = (_Var30._M_current)->first;
        uVar2 = ppVar26[1].second;
        iVar22 = piVar7[(int)uVar2];
        iVar18 = piVar6[(int)uVar1];
        iVar25 = iVar18;
        if (iVar22 < iVar18) {
          iVar25 = iVar22;
        }
        ppVar26 = _Var30._M_current;
      } while ((iVar25 == 2) && (iVar5 != 2));
      if ((iVar5 == 2) && (iVar25 != 2)) break;
      lVar19 = (long)iVar18 * (long)iVar22;
    } while ((lVar19 < lVar29) ||
            ((lVar19 - lVar29 == 0 || lVar19 < lVar29 &&
             ((iVar25 < iVar5 ||
              ((iVar25 <= iVar5 &&
               ((uVar28 = ((ulong)uVar2 + 0x80c8963be3e4c2f3) * ((ulong)uVar1 + 0xc8497d2a400d9551)
                          >> 0x20 ^ ((ulong)uVar2 + 0x8a183895eeac1536) *
                                    ((ulong)uVar1 + 0x42d8680e260ae5b), uVar28 < uVar20 ||
                ((uVar28 <= uVar20 &&
                 (((int)uVar1 < iVar11 || (((int)uVar1 <= iVar11 && ((int)uVar2 < iVar13))))))))))))
             ))));
    do {
      ppVar16 = ppVar21 + -1;
      uVar1 = ppVar21[-1].first;
      uVar2 = ppVar21[-1].second;
      iVar22 = piVar7[(int)uVar2];
      iVar18 = piVar6[(int)uVar1];
      iVar25 = iVar18;
      if (iVar22 < iVar18) {
        iVar25 = iVar22;
      }
      ppVar21 = ppVar16;
      if ((iVar25 == 2) && (iVar5 != 2)) goto LAB_0032521a;
      if ((iVar5 != 2) || (iVar25 == 2)) {
        lVar19 = (long)iVar22 * (long)iVar18;
        if ((lVar19 < lVar29) ||
           ((lVar19 - lVar29 == 0 || lVar19 < lVar29 &&
            ((iVar25 < iVar5 ||
             ((iVar25 <= iVar5 &&
              ((uVar28 = ((ulong)uVar2 + 0x80c8963be3e4c2f3) * ((ulong)uVar1 + 0xc8497d2a400d9551)
                         >> 0x20 ^ ((ulong)uVar1 + 0x42d8680e260ae5b) *
                                   ((ulong)uVar2 + 0x8a183895eeac1536), uVar28 < uVar20 ||
               ((uVar28 <= uVar20 &&
                (((int)uVar1 < iVar11 || (((int)uVar2 < iVar13 && ((int)uVar1 <= iVar11)))))))))))))
            ))) goto LAB_0032521a;
      }
    } while( true );
  }
LAB_00325226:
  end_00._M_current = _Var30._M_current + -1;
  (begin._M_current)->first = _Var30._M_current[-1].first;
  (begin._M_current)->second = _Var30._M_current[-1].second;
  _Var30._M_current[-1].first = iVar11;
  _Var30._M_current[-1].second = iVar13;
  uVar28 = (long)end_00._M_current - (long)begin._M_current >> 3;
  uVar20 = (long)end._M_current - (long)_Var30._M_current >> 3;
  if (((long)uVar28 < (long)(uVar14 >> 3)) || ((long)uVar20 < (long)(uVar14 >> 3))) {
    bad_allowed = bad_allowed + -1;
    if (bad_allowed == 0) {
      lVar29 = (long)((uVar14 - ((long)(uVar14 - 2) >> 0x3f)) + -2) >> 1;
      do {
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,std::pair<int,int>,__gnu_cxx::__ops::_Iter_comp_iter<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>>
                  (begin,lVar29,uVar14,begin._M_current[lVar29],
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:4999:7)>
                    )comp.this);
        bVar10 = lVar29 != 0;
        lVar29 = lVar29 + -1;
      } while (bVar10);
      _Var15._M_current = c._M_current;
      if (8 < lVar12) {
        do {
          (_Var15._M_current)->first = (begin._M_current)->first;
          (_Var15._M_current)->second = (begin._M_current)->second;
          lVar12 = lVar12 + -8;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,std::pair<int,int>,__gnu_cxx::__ops::_Iter_comp_iter<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>>
                    (begin,0,lVar12 >> 3,*_Var15._M_current,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:4999:7)>
                      )comp.this);
          _Var15._M_current = _Var15._M_current + -1;
        } while (8 < lVar12);
        bad_allowed = 0;
LAB_0032423e:
        bVar10 = true;
        goto LAB_00325435;
      }
      bad_allowed = 0;
      goto LAB_003254e9;
    }
    if (0x17 < (long)uVar28) {
      uVar14 = uVar28 >> 2;
      pVar8 = *begin._M_current;
      *begin._M_current = begin._M_current[uVar14];
      begin._M_current[uVar14] = pVar8;
      pVar8 = _Var30._M_current[-2];
      _Var30._M_current[-2] = _Var30._M_current[-1 - uVar14];
      _Var30._M_current[-1 - uVar14] = pVar8;
      if (0x80 < (long)uVar28) {
        pVar8 = begin._M_current[1];
        begin._M_current[1] = begin._M_current[uVar14 + 1];
        begin._M_current[uVar14 + 1] = pVar8;
        pVar8 = begin._M_current[2];
        begin._M_current[2] = begin._M_current[uVar14 + 2];
        begin._M_current[uVar14 + 2] = pVar8;
        pVar8 = _Var30._M_current[-3];
        _Var30._M_current[-3] = _Var30._M_current[~uVar14 - 1];
        _Var30._M_current[~uVar14 - 1] = pVar8;
        pVar8 = _Var30._M_current[-4];
        _Var30._M_current[-4] = _Var30._M_current[-uVar14 + -3];
        _Var30._M_current[-uVar14 + -3] = pVar8;
      }
    }
    if (0x17 < (long)uVar20) {
      uVar14 = uVar20 >> 2;
      pVar8 = *_Var30._M_current;
      *_Var30._M_current = _Var30._M_current[uVar14];
      _Var30._M_current[uVar14] = pVar8;
      pVar8 = end._M_current[-1];
      end._M_current[-1] = end._M_current[-uVar14];
      end._M_current[-uVar14] = pVar8;
      if (0x80 < (long)uVar20) {
        pVar8 = _Var30._M_current[1];
        _Var30._M_current[1] = _Var30._M_current[uVar14 + 1];
        _Var30._M_current[uVar14 + 1] = pVar8;
        pVar8 = _Var30._M_current[2];
        _Var30._M_current[2] = _Var30._M_current[uVar14 + 2];
        _Var30._M_current[uVar14 + 2] = pVar8;
        pVar8 = end._M_current[-2];
        end._M_current[-2] = end._M_current[~uVar14];
        end._M_current[~uVar14] = pVar8;
        pVar8 = end._M_current[-3];
        end._M_current[-3] = end._M_current[-2 - uVar14];
        end._M_current[-2 - uVar14] = pVar8;
      }
    }
  }
  else if (((_Var15._M_current <= ppVar17) &&
           (bVar10 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                               (begin,end_00,comp), bVar10)) &&
          (bVar10 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                              (_Var30,end,comp), bVar10)) {
LAB_003254e9:
    bVar10 = true;
    goto LAB_00325435;
  }
  pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1,false>
            (begin,end_00,comp,bad_allowed,(bool)(leftmost & 1));
  bVar10 = false;
  leftmost = false;
  begin._M_current = _Var30._M_current;
LAB_00325435:
  if (bVar10) {
    return;
  }
  goto LAB_00323eee;
LAB_0032521a:
  if (ppVar16 <= _Var30._M_current) goto LAB_00325226;
  goto LAB_00325065;
LAB_00324498:
  (_Var15._M_current)->first = iVar22;
  (_Var15._M_current)->second = local_a0;
LAB_003244b9:
  ppVar17 = ppVar21 + 1;
  _Var15._M_current = ppVar21;
  if (ppVar21 + 1 == end._M_current) goto LAB_0032423e;
  goto LAB_00324312;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }